

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiColumns::ImGuiColumns(ImGuiColumns *this)

{
  long in_RDI;
  ImRect *in_stack_ffffffffffffffd0;
  
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImVector<ImGuiColumnData>::ImVector((ImVector<ImGuiColumnData> *)(in_RDI + 0x50));
  ImDrawListSplitter::ImDrawListSplitter((ImDrawListSplitter *)(in_RDI + 0x60));
  Clear((ImGuiColumns *)0x2485fc);
  return;
}

Assistant:

ImGuiColumns()      { Clear(); }